

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicHandleInfo.hpp
# Opt level: O0

void __thiscall
helics::BasicHandleInfo::BasicHandleInfo
          (BasicHandleInfo *this,GlobalHandle gHandle,InterfaceType type_of_handle)

{
  undefined1 in_DL;
  pointer in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  
  (in_RDI->_M_dataplus)._M_p = in_RSI;
  this_00 = in_RDI;
  memset(&in_RDI->_M_string_length,0,4);
  LocalFederateId::LocalFederateId((LocalFederateId *)&in_RDI->_M_string_length);
  *(undefined1 *)((long)&in_RDI->_M_string_length + 4) = in_DL;
  *(undefined1 *)((long)&in_RDI->_M_string_length + 5) = 0;
  *(undefined2 *)((long)&in_RDI->_M_string_length + 6) = 0;
  std::__cxx11::string::string(this_00);
  std::__cxx11::string::string(this_00);
  std::__cxx11::string::string(this_00);
  in_RDI[3].field_2._M_allocated_capacity = (size_type)&in_RDI[1].field_2;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)((long)&in_RDI[3].field_2 + 8) = &in_RDI[2].field_2;
  CLI::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x602665);
  return;
}

Assistant:

BasicHandleInfo(GlobalHandle gHandle, InterfaceType type_of_handle) noexcept:
        handle{gHandle}, handleType(type_of_handle), type_in(type), type_out(units)
    {
    }